

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O2

void __thiscall
xmrig::SelfSelectClient::onLogin
          (SelfSelectClient *this,IClient *param_1,Document *doc,Value *params)

{
  StringRefType local_38;
  StringRefType local_28;
  
  local_28.s = "mode";
  local_28.length = 4;
  local_38.s = "self-select";
  local_38.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(params,&local_28,&local_38,doc->allocator_);
  (*this->m_listener->_vptr_IClientListener[4])(this->m_listener,this,doc,params);
  return;
}

Assistant:

void xmrig::SelfSelectClient::onLogin(IClient *, rapidjson::Document &doc, rapidjson::Value &params)
{
    params.AddMember("mode", "self-select", doc.GetAllocator());

    m_listener->onLogin(this, doc, params);
}